

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_iterator_end(set_iterator *it)

{
  long *in_RDI;
  undefined4 local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = 0;
  }
  else if (*(ulong *)(*in_RDI + 8) < *(ulong *)(*(long *)*in_RDI + 8)) {
    local_4 = 1;
  }
  else {
    free((void *)*in_RDI);
    *in_RDI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int set_iterator_end(set_iterator *it)
{
	if (it != NULL && *it != NULL)
	{
		if ((*it)->current_bucket >= (*it)->s->capacity)
		{
			free(*it);

			*it = NULL;

			return 0;
		}

		return 1;
	}

	return 0;
}